

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockstreambuf_unbuffered.cpp
# Opt level: O2

int_type __thiscall
dlib::sockstreambuf_unbuffered::pbackfail(sockstreambuf_unbuffered *this,int_type c)

{
  if (((c == -1) || (this->lastread == c)) && (this->lastread_next == false)) {
    this->lastread_next = true;
    return 1;
  }
  return -1;
}

Assistant:

sockstreambuf_unbuffered::int_type sockstreambuf_unbuffered::
    pbackfail(
        int_type c
    )
    {  
        // if they are trying to push back a character that they didn't read last
        // that is an error
        if (c != EOF && c != lastread)
            return EOF;

        // if they are trying to push back a second character then thats an error
        if (lastread_next)
            return EOF;

        lastread_next = true;
        return 1;
    }